

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O3

int64_t docio_read_doc_key_meta
                  (docio_handle *handle,uint64_t offset,docio_object *doc,bool read_on_cache_miss)

{
  err_log_callback *log_callback;
  undefined8 uVar1;
  docio_length dVar2;
  byte bVar3;
  undefined8 uVar4;
  uint8_t uVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint64_t offset_00;
  void *buf_out;
  void *pvVar8;
  uint uVar9;
  fdb_status status;
  uint uVar10;
  ulong uVar11;
  size_t line_number;
  uint uVar12;
  ulong uVar13;
  bool key_alloc;
  bool bVar14;
  bool meta_alloc;
  undefined1 auVar15 [16];
  char *format;
  ulong uVar16;
  char *pcVar17;
  timestamp_t _timestamp;
  docio_length _length;
  fdb_seqnum_t _seqnum;
  uint32_t local_50;
  uint8_t uStack_4c;
  uint8_t uStack_4b;
  uint16_t uStack_4a;
  undefined1 local_48 [16];
  
  _length.keylen = 0;
  _length.metalen = 0;
  _length.bodylen = 0;
  _length.bodylen_ondisk = 0;
  _length.flag = '\0';
  _length.checksum = '\0';
  _length.reserved = 0;
  log_callback = handle->log_callback;
  offset_00 = _docio_read_length(handle,offset,&_length,log_callback,read_on_cache_miss);
  dVar2 = _length;
  if ((long)offset_00 < 0) {
    if (read_on_cache_miss) {
      fdb_log_impl(log_callback,2,(fdb_status)offset_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"docio_read_doc_key_meta",0x465,
                   "Error in reading the doc length metadata with offset %lu from a database file \'%s\'"
                   ,offset,handle->file->filename);
    }
  }
  else {
    local_48 = (undefined1  [16])0x0;
    bVar3 = _length.bodylen._3_1_;
    uVar5 = _length.checksum;
    auVar15[0] = -((char)_length.keylen == '\0');
    auVar15[1] = -(_length.keylen._1_1_ == '\0');
    auVar15[2] = -((char)_length.metalen == '\0');
    auVar15[3] = -(_length.metalen._1_1_ == '\0');
    auVar15[4] = -((char)_length.bodylen == '\0');
    auVar15[5] = -(_length.bodylen._1_1_ == '\0');
    auVar15[6] = -(_length.bodylen._2_1_ == '\0');
    auVar15[7] = -(_length.bodylen._3_1_ == 0);
    auVar15[8] = -((char)_length.bodylen_ondisk == '\0');
    auVar15[9] = -(_length.bodylen_ondisk._1_1_ == '\0');
    auVar15[10] = -(_length.bodylen_ondisk._2_1_ == '\0');
    auVar15[0xb] = -(_length.bodylen_ondisk._3_1_ == '\0');
    auVar15[0xc] = -(_length.flag == '\0');
    auVar15[0xd] = -(_length.checksum == '\0');
    auVar15[0xe] = -((char)_length.reserved == '\0');
    auVar15[0xf] = -(_length.reserved._1_1_ == '\0');
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) == 0xffff) {
      (doc->length).keylen = 0;
      (doc->length).metalen = 0;
      (doc->length).bodylen = 0;
      (doc->length).bodylen_ondisk = 0;
      (doc->length).flag = '\0';
      (doc->length).checksum = '\0';
      (doc->length).reserved = 0;
      offset_00 = 0;
    }
    else {
      uVar1 = _length._0_8_;
      uVar4 = _length._8_8_;
      _seqnum._0_2_ = _length.keylen;
      _seqnum._2_2_ = _length.metalen;
      _seqnum._4_4_ = _length.bodylen;
      local_50 = _length.bodylen_ondisk;
      uStack_4c = _length.flag;
      uStack_4b = _length.checksum;
      uStack_4a = _length.reserved;
      _length = dVar2;
      uVar7 = get_checksum((uint8_t *)&_seqnum,0xc,handle->file->crc_mode);
      if (uVar5 == (uint8_t)uVar7) {
        uVar6 = dVar2.keylen << 8 | dVar2.keylen >> 8;
        uVar10 = dVar2._0_4_ >> 8 & 0xff00 | dVar2._3_4_ & 0xff;
        uVar12 = dVar2.bodylen;
        uVar9 = dVar2.bodylen_ondisk;
        uVar13 = uVar4 & 0xffffffff00000000 |
                 (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                        uVar9 << 0x18);
        uVar16 = (ulong)uVar6;
        uVar11 = uVar16 + ((ulong)(uVar12 << 0x18 | (uint)bVar3 | uVar12 >> 8 & 0xff00 |
                                  (uVar12 & 0xff00) << 8) << 0x20) | (ulong)(uVar10 << 0x10);
        (doc->length).keylen = (short)uVar11;
        (doc->length).metalen = (short)(uVar11 >> 0x10);
        (doc->length).bodylen = (int)(uVar11 >> 0x20);
        (doc->length).bodylen_ondisk = (int)uVar13;
        (doc->length).flag = (char)(uVar13 >> 0x20);
        (doc->length).checksum = (char)(uVar13 >> 0x28);
        (doc->length).reserved = (short)(uVar13 >> 0x30);
        if ((ushort)(uVar6 + 0xf) < 0x10) {
          fdb_log_impl(log_callback,2,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_read_doc_key_meta",0x482,
                       "Error in decoding the doc length metadata (key length: %d) from a database file \'%s\'"
                       ,uVar16,handle->file->filename);
          offset_00 = 0xfffffffffffffff0;
        }
        else {
          buf_out = doc->key;
          key_alloc = buf_out == (void *)0x0;
          if (key_alloc) {
            buf_out = malloc(uVar16);
            doc->key = buf_out;
          }
          bVar14 = doc->meta == (void *)0x0;
          meta_alloc = uVar10 != 0 && bVar14;
          if (meta_alloc) {
            pvVar8 = malloc((ulong)uVar10);
            doc->meta = pvVar8;
          }
          offset_00 = _docio_read_doc_component(handle,offset_00,(uint)uVar6,buf_out,log_callback);
          if ((long)offset_00 < 0) {
            fdb_log_impl(log_callback,2,(fdb_status)offset_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,"docio_read_doc_key_meta",0x495,
                         "Error in reading a key with offset %lu, length %d from a database file \'%s\'"
                         ,offset,(ulong)(doc->length).keylen,handle->file->filename);
          }
          else {
            offset_00 = _docio_read_doc_component(handle,offset_00,4,&_timestamp,log_callback);
            if ((long)offset_00 < 0) {
              fdb_log_impl(log_callback,2,(fdb_status)offset_00,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                           ,"docio_read_doc_key_meta",0x4a2,
                           "Error in reading a timestamp with offset %lu, length %d from a database file \'%s\'"
                           ,offset,4,handle->file->filename);
            }
            else {
              doc->timestamp =
                   _timestamp >> 0x18 | (_timestamp & 0xff0000) >> 8 | (_timestamp & 0xff00) << 8 |
                   _timestamp << 0x18;
              offset_00 = _docio_read_doc_component(handle,offset_00,8,&_seqnum,log_callback);
              if ((long)offset_00 < 0) {
                line_number = 0x4af;
                status = (fdb_status)offset_00;
                pcVar17 = handle->file->filename;
                uVar16 = 8;
                format = 
                "Error in reading a sequence number with offset %lu, length %d from a database file \'%s\'"
                ;
              }
              else {
                (doc->field_3).seqnum =
                     _seqnum >> 0x38 | (_seqnum & 0xff000000000000) >> 0x28 |
                     (_seqnum & 0xff0000000000) >> 0x18 | (_seqnum & 0xff00000000) >> 8 |
                     (_seqnum & 0xff000000) << 8 | (_seqnum & 0xff0000) << 0x18 |
                     (_seqnum & 0xff00) << 0x28 | _seqnum << 0x38;
                offset_00 = _docio_read_doc_component
                                      (handle,offset_00,(uint)(doc->length).metalen,doc->meta,
                                       log_callback);
                if (-1 < (long)offset_00) {
                  if (uVar10 == 0 || !bVar14) {
                    return offset_00;
                  }
                  if ((doc->length).metalen != 0) {
                    return offset_00;
                  }
                  free(doc->meta);
                  doc->meta = (void *)0x0;
                  return offset_00;
                }
                uVar16 = (ulong)(doc->length).metalen;
                line_number = 0x4bb;
                status = (fdb_status)offset_00;
                pcVar17 = handle->file->filename;
                format = 
                "Error in reading the doc metadata with offset %lu, length %d from a database file \'%s\'"
                ;
              }
              fdb_log_impl(log_callback,2,status,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                           ,"docio_read_doc_key_meta",line_number,format,offset,uVar16,pcVar17);
            }
          }
          free_docio_object(doc,key_alloc,meta_alloc,'\0');
        }
      }
      else {
        fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc_key_meta",0x47a,
                     "doc_length meta checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                     ,handle->file->filename,(ulong)(uVar7 & 0xff),(ulong)(dVar2._12_4_ >> 8 & 0xff)
                     ,uVar1 & 0xffff,(ulong)uVar1 >> 0x10 & 0xffff,(ulong)uVar1 >> 0x20,uVar4,offset
                    );
        offset_00 = 0xfffffffffffffff1;
      }
    }
  }
  return offset_00;
}

Assistant:

int64_t docio_read_doc_key_meta(struct docio_handle *handle, uint64_t offset,
                                struct docio_object *doc,
                                bool read_on_cache_miss)
{
    uint8_t checksum;
    int64_t _offset;
    int key_alloc = 0;
    int meta_alloc = 0;
    fdb_seqnum_t _seqnum;
    timestamp_t _timestamp;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback,
                                 read_on_cache_miss);
    if (_offset < 0) {
        if (read_on_cache_miss) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading the doc length metadata with offset %" _F64 " from "
                    "a database file '%s'",
                    offset, handle->file->filename);
        }
        return _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        doc->length = zero_length;
        return (int64_t) FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length meta checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }

    doc->length = _docio_length_decode(_length);
    if (doc->length.keylen == 0 || doc->length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata (key length: %d) from "
                "a database file '%s'", doc->length.keylen, handle->file->filename);
        return (int64_t) FDB_RESULT_FILE_CORRUPTION;
    }

    if (doc->key == NULL) {
        doc->key = (void *)malloc(doc->length.keylen);
        key_alloc = 1;
    }
    if (doc->meta == NULL && doc->length.metalen) {
        doc->meta = (void *)malloc(doc->length.metalen);
        meta_alloc = 1;
    }

    _offset = _docio_read_doc_component(handle, _offset, doc->length.keylen,
                                        doc->key, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.keylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }

    // read timestamp
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(timestamp_t),
                                        &_timestamp, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a timestamp with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(timestamp_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }
    doc->timestamp = _endian_decode(_timestamp);

    // copy sequence number (optional)
    _offset = _docio_read_doc_component(handle, _offset, sizeof(fdb_seqnum_t),
                                        (void *)&_seqnum, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a sequence number with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(fdb_seqnum_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }
    doc->seqnum = _endian_decode(_seqnum);

    _offset = _docio_read_doc_component(handle, _offset, doc->length.metalen,
                                        doc->meta, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc metadata with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.metalen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }

    uint8_t free_meta = meta_alloc && !doc->length.metalen;
    free_docio_object(doc, 0, free_meta, 0);

    return _offset;
}